

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

opj_bool j2k_encode(opj_j2k_t *j2k,opj_cio_t *cio,opj_image_t *image,
                   opj_codestream_info_t *cstr_info)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  OPJ_UINT32 OVar10;
  opj_cp_t *cp;
  opj_tcp_t *poVar11;
  opj_codestream_info_t *cstr_info_00;
  opj_image_t *poVar12;
  opj_cp_t *poVar13;
  char *__s;
  opj_tp_info_t *poVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  opj_tile_info_t *poVar21;
  int *piVar22;
  opj_marker_info_t *poVar23;
  size_t sVar24;
  opj_tcd_t *tcd;
  int iVar25;
  ulong uVar26;
  int iVar27;
  opj_cio_t *poVar28;
  long lVar29;
  ulong uVar30;
  int local_6c;
  
  j2k->cio = cio;
  j2k->image = image;
  cp = j2k->cp;
  j2k->cstr_info = cstr_info;
  poVar28 = cio;
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    iVar16 = cp->tw;
    iVar17 = cp->th;
    poVar21 = (opj_tile_info_t *)malloc((long)(iVar17 * iVar16) * 0x260);
    cstr_info->tile = poVar21;
    uVar2 = image->x1;
    uVar4 = image->y1;
    uVar3 = image->x0;
    uVar5 = image->y0;
    cstr_info->image_w = uVar2 - uVar3;
    cstr_info->image_h = uVar4 - uVar5;
    poVar11 = cp->tcps;
    cstr_info->prog = poVar11->prg;
    cstr_info->tw = iVar16;
    cstr_info->th = iVar17;
    uVar6 = cp->tx0;
    uVar7 = cp->ty0;
    uVar8 = cp->tdx;
    uVar9 = cp->tdy;
    cstr_info->tile_x = uVar8;
    cstr_info->tile_y = uVar9;
    cstr_info->tile_Ox = uVar6;
    cstr_info->tile_Oy = uVar7;
    uVar18 = image->numcomps;
    cstr_info->numcomps = uVar18;
    cstr_info->numlayers = poVar11->numlayers;
    piVar22 = (int *)malloc((ulong)uVar18 * 4);
    cstr_info->numdecompos = piVar22;
    for (uVar26 = 0; uVar18 != uVar26; uVar26 = uVar26 + 1) {
      piVar22[uVar26] = poVar11->tccps->numresolutions - 1;
    }
    cstr_info->D_max = 0.0;
    iVar16 = cio_tell(cio);
    cstr_info->main_head_start = iVar16;
    cstr_info->maxmarknum = 100;
    poVar23 = (opj_marker_info_t *)malloc(0x960);
    cstr_info->marker = poVar23;
    cstr_info->marknum = 0;
    poVar28 = j2k->cio;
  }
  cio_write(poVar28,0xff4f,2);
  cstr_info_00 = j2k->cstr_info;
  if (cstr_info_00 != (opj_codestream_info_t *)0x0) {
    iVar16 = cio_tell(poVar28);
    j2k_add_mhmarker(cstr_info_00,0xff4f,iVar16,0);
  }
  poVar28 = j2k->cio;
  poVar12 = j2k->image;
  poVar13 = j2k->cp;
  cio_write(poVar28,0xff51,2);
  iVar16 = cio_tell(poVar28);
  cio_skip(poVar28,2);
  cio_write(poVar28,(ulong)poVar13->rsiz,2);
  cio_write(poVar28,(ulong)poVar12->x1,4);
  cio_write(poVar28,(ulong)poVar12->y1,4);
  cio_write(poVar28,(ulong)poVar12->x0,4);
  cio_write(poVar28,(ulong)poVar12->y0,4);
  cio_write(poVar28,(long)poVar13->tdx,4);
  cio_write(poVar28,(long)poVar13->tdy,4);
  cio_write(poVar28,(long)poVar13->tx0,4);
  cio_write(poVar28,(long)poVar13->ty0,4);
  cio_write(poVar28,(ulong)poVar12->numcomps,2);
  lVar29 = 0;
  for (uVar26 = 0; uVar26 < poVar12->numcomps; uVar26 = uVar26 + 1) {
    cio_write(poVar28,(ulong)((*(int *)((long)&poVar12->comps->prec + lVar29) +
                              *(int *)((long)&poVar12->comps->sgnd + lVar29) * 0x80) - 1),1);
    cio_write(poVar28,(ulong)*(uint *)((long)&poVar12->comps->dx + lVar29),1);
    cio_write(poVar28,(ulong)*(uint *)((long)&poVar12->comps->dy + lVar29),1);
    lVar29 = lVar29 + 0x38;
  }
  iVar17 = cio_tell(poVar28);
  cio_seek(poVar28,iVar16);
  cio_write(poVar28,(long)(iVar17 - iVar16),2);
  cio_seek(poVar28,iVar17);
  if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
    j2k_add_mhmarker(j2k->cstr_info,0xff51,iVar16,iVar17 - iVar16);
  }
  poVar28 = j2k->cio;
  cio_write(poVar28,0xff52,2);
  iVar17 = cio_tell(poVar28);
  cio_skip(poVar28,2);
  poVar11 = j2k->cp->tcps;
  iVar16 = j2k->curtileno;
  cio_write(poVar28,(long)poVar11[iVar16].csty,1);
  cio_write(poVar28,(long)poVar11[iVar16].prg,1);
  cio_write(poVar28,(long)poVar11[iVar16].numlayers,2);
  cio_write(poVar28,(long)poVar11[iVar16].mct,1);
  j2k_write_cox(j2k,0);
  iVar16 = cio_tell(poVar28);
  cio_seek(poVar28,iVar17);
  cio_write(poVar28,(long)(iVar16 - iVar17),2);
  cio_seek(poVar28,iVar16);
  if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
    j2k_add_mhmarker(j2k->cstr_info,0xff52,iVar17,iVar16 - iVar17);
  }
  poVar28 = j2k->cio;
  cio_write(poVar28,0xff5c,2);
  iVar16 = cio_tell(poVar28);
  cio_skip(poVar28,2);
  j2k_write_qcx(j2k,0);
  uVar18 = cio_tell(poVar28);
  cio_seek(poVar28,iVar16);
  cio_write(poVar28,(long)(int)(uVar18 - iVar16),2);
  uVar26 = (ulong)uVar18;
  cio_seek(poVar28,uVar18);
  if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
    uVar26 = 0xff5c;
    j2k_add_mhmarker(j2k->cstr_info,0xff5c,iVar16,uVar18 - iVar16);
  }
  uVar30 = 1;
  if (cp->cinema != OFF) {
    while (uVar18 = (uint)uVar30, uVar18 < image->numcomps) {
      j2k_write_coc(j2k,uVar18);
      j2k_write_qcc(j2k,uVar18);
      uVar26 = uVar30;
      uVar30 = (ulong)(uVar18 + 1);
    }
  }
  lVar29 = 0x328;
  for (uVar30 = 0; iVar16 = (int)uVar26, uVar30 < image->numcomps; uVar30 = uVar30 + 1) {
    if (*(int *)((long)cp->tcps->tccps->stepsizes + lVar29 + -0x1c) != 0) {
      poVar11 = j2k->cp->tcps;
      poVar28 = j2k->cio;
      OVar10 = j2k->image->numcomps;
      cio_write(poVar28,0xff5e,2);
      bVar15 = (int)OVar10 < 0x101;
      cio_write(poVar28,6 - (ulong)bVar15,2);
      cio_write(poVar28,uVar30,2 - (uint)bVar15);
      cio_write(poVar28,0,1);
      uVar26 = (ulong)*(int *)((long)poVar11->tccps->stepsizes + lVar29 + -0x1c);
      cio_write(poVar28,uVar26,1);
    }
    lVar29 = lVar29 + 0x438;
  }
  if ((cp->comment != (char *)0x0) && (__s = j2k->cp->comment, __s != (char *)0x0)) {
    poVar28 = j2k->cio;
    cio_write(poVar28,0xff64,2);
    iVar17 = cio_tell(poVar28);
    cio_skip(poVar28,2);
    cio_write(poVar28,1,2);
    uVar18 = 0;
    while( true ) {
      sVar24 = strlen(__s);
      if (sVar24 <= uVar18) break;
      cio_write(poVar28,(long)__s[uVar18],1);
      uVar18 = uVar18 + 1;
    }
    iVar16 = cio_tell(poVar28);
    iVar27 = iVar16 - iVar17;
    cio_seek(poVar28,iVar17);
    cio_write(poVar28,(long)iVar27,2);
    cio_seek(poVar28,iVar16);
    if (j2k->cstr_info != (opj_codestream_info_t *)0x0) {
      iVar16 = 0xff64;
      j2k_add_mhmarker(j2k->cstr_info,0xff64,iVar17,iVar27);
    }
  }
  iVar16 = j2k_calculate_tp(cp,iVar16,image,j2k);
  j2k->totnum_tp = iVar16;
  if (cp->cinema != OFF) {
    poVar28 = j2k->cio;
    iVar16 = cio_tell(poVar28);
    j2k->tlm_start = iVar16;
    cio_write(poVar28,0xff55,2);
    cio_write(poVar28,(long)j2k->totnum_tp * 5 + 4,2);
    cio_write(poVar28,0,1);
    cio_write(poVar28,0x50,1);
    cio_skip(poVar28,j2k->totnum_tp * 5);
    if (cp->cinema == CINEMA4K_24) {
      j2k_write_poc(j2k);
    }
  }
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    iVar16 = cio_tell(cio);
    cstr_info->main_head_end = iVar16 + -1;
  }
  tcd = tcd_create(j2k->cinfo);
  lVar29 = 0;
  do {
    if ((long)cp->th * (long)cp->tw <= lVar29) {
      tcd_free_encode(tcd);
      tcd_destroy(tcd);
      free(j2k->cur_totnum_tp);
      cio_write(j2k->cio,0xffd9,2);
      if (cstr_info != (opj_codestream_info_t *)0x0) {
        iVar16 = cio_tell(cio);
        cstr_info->codestream_size = (iVar16 + j2k->pos_correction) - cstr_info->main_head_start;
      }
      return 1;
    }
    poVar11 = cp->tcps;
    lVar1 = lVar29 + 1;
    opj_event_msg(j2k->cinfo,4,"tile number %d / %d\n");
    iVar16 = (int)lVar29;
    j2k->curtileno = iVar16;
    j2k->cur_tp_num = 0;
    tcd->cur_totnum_tp = j2k->cur_totnum_tp[lVar29];
    if (lVar29 == 0) {
      tcd_malloc_encode(tcd,image,cp,0);
    }
    else {
      tcd_init_encode(tcd,image,cp,iVar16);
    }
    if (cstr_info != (opj_codestream_info_t *)0x0) {
      iVar27 = cio_tell(cio);
      poVar21 = cstr_info->tile;
      iVar17 = j2k->curtileno;
      poVar21[iVar17].start_pos = iVar27 + j2k->pos_correction;
      poVar21[iVar17].maxmarknum = 10;
      poVar23 = (opj_marker_info_t *)malloc(0xf0);
      poVar21[iVar17].marker = poVar23;
      poVar21[iVar17].marknum = 0;
    }
    local_6c = 0;
    for (iVar17 = 0; iVar17 <= poVar11[lVar29].numpocs; iVar17 = iVar17 + 1) {
      tcd->cur_pino = iVar17;
      iVar27 = j2k_get_num_tp(cp,iVar17,iVar16);
      tcd->tp_pos = cp->tp_pos;
      iVar25 = 0;
      if (iVar27 < 1) {
        iVar27 = iVar25;
      }
      for (; iVar25 != iVar27; iVar25 = iVar25 + 1) {
        j2k->tp_num = iVar25;
        if (cstr_info != (opj_codestream_info_t *)0x0) {
          iVar19 = cio_tell(cio);
          cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_start_pos =
               iVar19 + j2k->pos_correction;
        }
        poVar28 = j2k->cio;
        iVar19 = cio_tell(poVar28);
        j2k->sot_start = iVar19;
        cio_write(poVar28,0xff90,2);
        iVar19 = cio_tell(poVar28);
        cio_skip(poVar28,2);
        cio_write(poVar28,(long)j2k->curtileno,2);
        cio_skip(poVar28,4);
        cio_write(poVar28,(long)j2k->cur_tp_num,1);
        cio_write(poVar28,(long)j2k->cur_totnum_tp[j2k->curtileno],1);
        iVar20 = cio_tell(poVar28);
        cio_seek(poVar28,iVar19);
        cio_write(poVar28,(long)(iVar20 - iVar19),2);
        cio_seek(poVar28,iVar20);
        if (j2k->cstr_info == (opj_codestream_info_t *)0x0) {
LAB_00121237:
          if ((j2k->cur_tp_num == 0) && (cp->cinema == OFF)) {
            for (uVar18 = 1; uVar18 < image->numcomps; uVar18 = uVar18 + 1) {
              j2k_write_coc(j2k,uVar18);
              j2k_write_qcc(j2k,uVar18);
            }
            if (cp->tcps[lVar29].numpocs != 0) {
              j2k_write_poc(j2k);
            }
          }
        }
        else if (j2k->cur_tp_num == 0) {
          j2k_add_tlmarker(j2k->curtileno,j2k->cstr_info,0xff90,iVar19,iVar20 - iVar19);
          goto LAB_00121237;
        }
        if (cstr_info == (opj_codestream_info_t *)0x0) {
          j2k_write_sod(j2k,tcd);
          iVar19 = j2k->cur_tp_num;
        }
        else {
          iVar19 = cio_tell(cio);
          cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_header =
               iVar19 + j2k->pos_correction + 1;
          j2k_write_sod(j2k,tcd);
          iVar20 = cio_tell(cio);
          poVar14 = cstr_info->tile[j2k->curtileno].tp;
          iVar19 = j2k->cur_tp_num;
          poVar14[iVar19].tp_end_pos = j2k->pos_correction + iVar20 + -1;
          poVar14[iVar19].tp_start_pack = local_6c;
          iVar20 = cstr_info->packno;
          poVar14[iVar19].tp_numpacks = iVar20 - local_6c;
          local_6c = iVar20;
        }
        j2k->cur_tp_num = iVar19 + 1;
      }
    }
    lVar29 = lVar1;
    if (cstr_info != (opj_codestream_info_t *)0x0) {
      iVar16 = cio_tell(cio);
      cstr_info->tile[j2k->curtileno].end_pos = iVar16 + j2k->pos_correction + -1;
    }
  } while( true );
}

Assistant:

opj_bool j2k_encode(opj_j2k_t *j2k, opj_cio_t *cio, opj_image_t *image, opj_codestream_info_t *cstr_info) {
	int tileno, compno;
	opj_cp_t *cp = NULL;

	opj_tcd_t *tcd = NULL;	/* TCD component */

	j2k->cio = cio;	
	j2k->image = image;

	cp = j2k->cp;

	/* INDEX >> */
	j2k->cstr_info = cstr_info;
	if (cstr_info) {
		int compno;
		cstr_info->tile = (opj_tile_info_t *) opj_malloc(cp->tw * cp->th * sizeof(opj_tile_info_t));
		cstr_info->image_w = image->x1 - image->x0;
		cstr_info->image_h = image->y1 - image->y0;
		cstr_info->prog = (&cp->tcps[0])->prg;
		cstr_info->tw = cp->tw;
		cstr_info->th = cp->th;
		cstr_info->tile_x = cp->tdx;	/* new version parser */
		cstr_info->tile_y = cp->tdy;	/* new version parser */
		cstr_info->tile_Ox = cp->tx0;	/* new version parser */
		cstr_info->tile_Oy = cp->ty0;	/* new version parser */
		cstr_info->numcomps = image->numcomps;
		cstr_info->numlayers = (&cp->tcps[0])->numlayers;
		cstr_info->numdecompos = (int*) opj_malloc(image->numcomps * sizeof(int));
		for (compno=0; compno < image->numcomps; compno++) {
			cstr_info->numdecompos[compno] = (&cp->tcps[0])->tccps->numresolutions - 1;
		}
		cstr_info->D_max = 0.0;		/* ADD Marcela */
		cstr_info->main_head_start = cio_tell(cio); /* position of SOC */
		cstr_info->maxmarknum = 100;
		cstr_info->marker = (opj_marker_info_t *) opj_malloc(cstr_info->maxmarknum * sizeof(opj_marker_info_t));
		cstr_info->marknum = 0;
	}
	/* << INDEX */

	j2k_write_soc(j2k);
	j2k_write_siz(j2k);
	j2k_write_cod(j2k);
	j2k_write_qcd(j2k);

	if(cp->cinema){
		for (compno = 1; compno < image->numcomps; compno++) {
			j2k_write_coc(j2k, compno);
			j2k_write_qcc(j2k, compno);
		}
	}

	for (compno = 0; compno < image->numcomps; compno++) {
		opj_tcp_t *tcp = &cp->tcps[0];
		if (tcp->tccps[compno].roishift)
			j2k_write_rgn(j2k, compno, 0);
	}
	if (cp->comment != NULL) {
		j2k_write_com(j2k);
	}

	j2k->totnum_tp = j2k_calculate_tp(cp,image->numcomps,image,j2k);
	/* TLM Marker*/
	if(cp->cinema){
		j2k_write_tlm(j2k);
		if (cp->cinema == CINEMA4K_24) {
			j2k_write_poc(j2k);
		}
	}

	/* uncomment only for testing JPSEC marker writing */
	/* j2k_write_sec(j2k); */

	/* INDEX >> */
	if(cstr_info) {
		cstr_info->main_head_end = cio_tell(cio) - 1;
	}
	/* << INDEX */
	/**** Main Header ENDS here ***/

	/* create the tile encoder */
	tcd = tcd_create(j2k->cinfo);

	/* encode each tile */
	for (tileno = 0; tileno < cp->tw * cp->th; tileno++) {
		int pino;
		int tilepartno=0;
		/* UniPG>> */
		int acc_pack_num = 0;
		/* <<UniPG */


		opj_tcp_t *tcp = &cp->tcps[tileno];
		opj_event_msg(j2k->cinfo, EVT_INFO, "tile number %d / %d\n", tileno + 1, cp->tw * cp->th);

		j2k->curtileno = tileno;
		j2k->cur_tp_num = 0;
		tcd->cur_totnum_tp = j2k->cur_totnum_tp[j2k->curtileno];
		/* initialisation before tile encoding  */
		if (tileno == 0) {
			tcd_malloc_encode(tcd, image, cp, j2k->curtileno);
		} else {
			tcd_init_encode(tcd, image, cp, j2k->curtileno);
		}

		/* INDEX >> */
		if(cstr_info) {
			cstr_info->tile[j2k->curtileno].start_pos = cio_tell(cio) + j2k->pos_correction;
			cstr_info->tile[j2k->curtileno].maxmarknum = 10;
			cstr_info->tile[j2k->curtileno].marker = (opj_marker_info_t *) opj_malloc(cstr_info->tile[j2k->curtileno].maxmarknum * sizeof(opj_marker_info_t));
			cstr_info->tile[j2k->curtileno].marknum = 0;
		}
		/* << INDEX */

		for(pino = 0; pino <= tcp->numpocs; pino++) {
			int tot_num_tp;
			tcd->cur_pino=pino;

			/*Get number of tile parts*/
			tot_num_tp = j2k_get_num_tp(cp,pino,tileno);
			tcd->tp_pos = cp->tp_pos;

			for(tilepartno = 0; tilepartno < tot_num_tp ; tilepartno++){
				j2k->tp_num = tilepartno;
				/* INDEX >> */
				if(cstr_info)
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_start_pos =
					cio_tell(cio) + j2k->pos_correction;
				/* << INDEX */
				j2k_write_sot(j2k);

				if(j2k->cur_tp_num == 0 && cp->cinema == 0){
					for (compno = 1; compno < image->numcomps; compno++) {
						j2k_write_coc(j2k, compno);
						j2k_write_qcc(j2k, compno);
					}
					if (cp->tcps[tileno].numpocs) {
						j2k_write_poc(j2k);
					}
				}

				/* INDEX >> */
				if(cstr_info)
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_header =
					cio_tell(cio) + j2k->pos_correction + 1;
				/* << INDEX */

				j2k_write_sod(j2k, tcd);

				/* INDEX >> */
				if(cstr_info) {
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_end_pos =
						cio_tell(cio) + j2k->pos_correction - 1;
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_start_pack =
						acc_pack_num;
					cstr_info->tile[j2k->curtileno].tp[j2k->cur_tp_num].tp_numpacks =
						cstr_info->packno - acc_pack_num;
					acc_pack_num = cstr_info->packno;
				}
				/* << INDEX */

				j2k->cur_tp_num++;
			}			
		}
		if(cstr_info) {
			cstr_info->tile[j2k->curtileno].end_pos = cio_tell(cio) + j2k->pos_correction - 1;
		}


		/*
		if (tile->PPT) { // BAD PPT !!! 
		FILE *PPT_file;
		int i;
		PPT_file=fopen("PPT","rb");
		fprintf(stderr,"%c%c%c%c",255,97,tile->len_ppt/256,tile->len_ppt%256);
		for (i=0;i<tile->len_ppt;i++) {
		unsigned char elmt;
		fread(&elmt, 1, 1, PPT_file);
		fwrite(&elmt,1,1,f);
		}
		fclose(PPT_file);
		unlink("PPT");
		}
		*/

	}

	/* destroy the tile encoder */
	tcd_free_encode(tcd);
	tcd_destroy(tcd);

	opj_free(j2k->cur_totnum_tp);

	j2k_write_eoc(j2k);

	if(cstr_info) {
		cstr_info->codestream_size = cio_tell(cio) + j2k->pos_correction;
		/* UniPG>> */
		/* The following adjustment is done to adjust the codestream size */
		/* if SOD is not at 0 in the buffer. Useful in case of JP2, where */
		/* the first bunch of bytes is not in the codestream              */
		cstr_info->codestream_size -= cstr_info->main_head_start;
		/* <<UniPG */
	}

#ifdef USE_JPWL
	/*
	preparation of JPWL marker segments
	*/
	if(cp->epc_on) {

		/* encode according to JPWL */
		jpwl_encode(j2k, cio, image);

	}
#endif /* USE_JPWL */

	return OPJ_TRUE;
}